

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
treeFind(overlap_iterator *this)

{
  pointer pEVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  PointerIntPair<void_*,_6U,_6U,_unsigned_int> PVar4;
  int iVar5;
  uint32_t local_4c;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *local_48;
  NodeRef local_40;
  interval<unsigned_long> *local_38;
  
  if (((this->super_iterator).super_const_iterator.path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0) &&
     (pEVar1 = (this->super_iterator).super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar1->offset < pEVar1->size)) {
    local_48 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
               &(this->super_iterator).super_const_iterator.path;
    uVar2 = (uint32_t)
            (this->super_iterator).super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    pEVar1 = (this->super_iterator).super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    PVar4.value = *(ulong *)((long)pEVar1[uVar2 - 1].node + (ulong)pEVar1[uVar2 - 1].offset * 8);
    uVar3 = ((this->super_iterator).super_const_iterator.map)->height;
    if (uVar3 != uVar2) {
      local_38 = &this->searchKey;
      iVar5 = uVar2 - uVar3;
      do {
        uVar3 = ((uint)PVar4.value & 0x3f) + 1;
        uVar2 = IntervalMapDetails::
                NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                                    *)(PVar4.value & 0xffffffffffffffc0),0,uVar3,local_38);
        if (uVar2 == uVar3) {
          const_iterator::setRoot
                    ((const_iterator *)this,
                     ((this->super_iterator).super_const_iterator.map)->rootSize);
          return;
        }
        local_4c = uVar2;
        local_40.pip.value =
             (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
             (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar4.value;
        SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
        emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                  (local_48,&local_40,&local_4c);
        PVar4.value = *(uintptr_t *)
                       ((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
                         *)(PVar4.value & 0xffffffffffffffc0) + (ulong)uVar2 * 8);
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
    }
    uVar2 = ((uint)PVar4.value & 0x3f) + 1;
    if (((this->super_iterator).super_const_iterator.map)->height == 0) {
      uVar3 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
              ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
                                  *)(PVar4.value & 0xffffffffffffffc0),0,uVar2,&this->searchKey);
    }
    else {
      uVar3 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>_>
              ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_false>_>
                                  *)(PVar4.value & 0xffffffffffffffc0),0,uVar2,&this->searchKey);
    }
    if (uVar3 == uVar2) {
      const_iterator::setRoot
                ((const_iterator *)this,((this->super_iterator).super_const_iterator.map)->rootSize)
      ;
    }
    else {
      local_4c = uVar3;
      local_40.pip.value =
           (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
           (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)PVar4.value;
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>(local_48,&local_40,&local_4c);
    }
  }
  return;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return len == 0; }